

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ProblemType Clasp::detectProblemType(istream *in)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = std::istream::peek();
  if (uVar2 != 0xffffffff) {
    uVar5 = 1;
    uVar3 = 1;
    do {
      iVar4 = uVar2 << 0x18;
      if ((iVar4 == 0x20000000) || (iVar4 == 0x9000000)) {
        std::istream::get();
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      else {
        cVar1 = (char)uVar2;
        if ((cVar1 == 'a') || ((byte)(cVar1 - 0x30U) < 10)) {
          return Asp;
        }
        if (cVar1 == '*') {
          return Pb;
        }
        if (((uVar2 & 0xff) == 99) || ((uVar2 & 0xff) == 0x70)) {
          return Sat;
        }
        if (iVar4 != 0xa000000) {
          Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x34,
                         "c == \'\\n\'",
                         "parse error in line %d:%d: \'%c\': unrecognized input format",(ulong)uVar3
                         ,uVar5,(ulong)(uint)(iVar4 >> 0x18),0);
        }
        std::istream::get();
        uVar3 = uVar3 + 1;
      }
      uVar2 = std::istream::peek();
    } while (uVar2 != 0xffffffff);
  }
  Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x38,"false",
                 "bad input stream",0);
}

Assistant:

ProblemType detectProblemType(std::istream& in) {
	for (std::istream::int_type x, line = 1, pos = 1; (x = in.peek()) != std::char_traits<char>::eof();) {
		char c = static_cast<char>(x);
		if (c == ' ' || c == '\t')  { in.get(); ++pos; continue; }
		if (AspParser::accept(c))   { return Problem_t::Asp; }
		if (DimacsReader::accept(c)){ return Problem_t::Sat; }
		if (OpbReader::accept(c))   { return Problem_t::Pb;  }
		POTASSCO_REQUIRE(c == '\n', "parse error in line %d:%d: '%c': unrecognized input format", (int)line,(int)pos, c);
		in.get();
		++line;
	}
	POTASSCO_REQUIRE(false, "bad input stream");
}